

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall
ExecutionEngine::populateMultiarray
          (ExecutionEngine *this,ArrayObject *array,ValueType valueType,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *count)

{
  _Map_pointer ppiVar1;
  _Elt_pointer piVar2;
  long lVar3;
  anon_union_8_10_52016fac_for_data this_00;
  long lVar4;
  int iVar5;
  ValueType type;
  Value value;
  Value value_00;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  piVar2 = (count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (piVar2 == (count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar2 = (count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node[-1] + 0x80;
  }
  iVar5 = piVar2[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&count->c);
  ppiVar1 = (count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  lVar3 = ((long)(count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 2) +
          ((((ulong)((long)ppiVar1 -
                    (long)(count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppiVar1 == (_Map_pointer)0x0)) * 0x80;
  lVar4 = (long)(count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_last -
          (long)(count->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur >> 2;
  type = REFERENCE;
  if ((ulong)(lVar3 + lVar4) < 2) {
    type = valueType;
  }
  if (lVar4 + lVar3 == 0) {
    if (0 < iVar5) {
      value_00.type = valueType;
      value_00.printType = valueType;
      do {
        value_00.data.longValue = 0;
        ArrayObject::pushValue(array,value_00);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  else if (0 < iVar5) {
    do {
      this_00.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)this_00.object,type);
      std::deque<int,_std::allocator<int>_>::deque
                ((deque<int,_std::allocator<int>_> *)&local_80,&count->c);
      populateMultiarray(this,(ArrayObject *)this_00.object,valueType,
                         (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
      value.data.object = (Object *)this_00.longValue;
      value.printType = BOOLEAN;
      value.type = REFERENCE;
      ArrayObject::pushValue(array,value);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

void ExecutionEngine::populateMultiarray(ArrayObject *array, ValueType valueType, stack<int> count) {
    int currCount = count.top();
    count.pop();
    
    ValueType arrayType = (count.size() > 1) ? ValueType::REFERENCE : valueType;
    
    if (count.size() == 0) {
        for (int i = 0; i < currCount; i++) {
            Value subarrayValue;
            subarrayValue.type = valueType;
            subarrayValue.printType = valueType;
            subarrayValue.data.longValue = 0;
            array->pushValue(subarrayValue);
        }
    } else {
        for (int i = 0; i < currCount; i++) {
            ArrayObject *subarray = new ArrayObject(arrayType);
            populateMultiarray(subarray, valueType, count);
            
            Value subarrayValue;
            subarrayValue.type = ValueType::REFERENCE;
            subarrayValue.data.object = subarray;
            array->pushValue(subarrayValue);
        }
    }
}